

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anti_exfil.c
# Opt level: O3

int wally_ae_signer_commit_from_bytes
              (uchar *priv_key,size_t priv_key_len,uchar *bytes,size_t bytes_len,uchar *commitment,
              size_t commitment_len,uint32_t flags,uchar *s2c_opening_out,size_t s2c_opening_out_len
              )

{
  secp256k1_context_struct *ctx;
  int iVar1;
  size_t sVar2;
  int iVar3;
  undefined1 auVar4 [16];
  secp256k1_ecdsa_s2c_opening local_70;
  
  sVar2 = bytes_len;
  ctx = secp_ctx();
  auVar4._0_4_ = -(uint)(priv_key == (uchar *)0x0);
  auVar4._4_4_ = -(uint)(bytes == (uchar *)0x0);
  auVar4._8_4_ = -(uint)(commitment == (uchar *)0x0);
  auVar4._12_4_ = -(uint)(s2c_opening_out == (uchar *)0x0);
  iVar1 = movmskps((int)sVar2,auVar4);
  iVar3 = -2;
  if ((((iVar1 == 0) && (priv_key_len == 0x20)) && (bytes_len == 0x20)) &&
     (((commitment_len == 0x20 && (s2c_opening_out_len == 0x21)) && (flags == 1)))) {
    if (ctx == (secp256k1_context_struct *)0x0) {
      iVar3 = -3;
    }
    else {
      iVar1 = secp256k1_ecdsa_anti_exfil_signer_commit(ctx,&local_70,bytes,priv_key,commitment);
      if (iVar1 == 0) {
        iVar3 = -2;
      }
      else {
        iVar1 = secp256k1_ecdsa_s2c_opening_serialize(ctx,s2c_opening_out,&local_70);
        iVar3 = (uint)(iVar1 != 0) * 2 + -2;
      }
      wally_clear(&local_70,0x40);
    }
  }
  return iVar3;
}

Assistant:

WALLY_CORE_API int wally_ae_signer_commit_from_bytes(
    const unsigned char *priv_key,
    size_t priv_key_len,
    const unsigned char *bytes,
    size_t bytes_len,
    const unsigned char *commitment,
    size_t commitment_len,
    uint32_t flags,
    unsigned char *s2c_opening_out,
    size_t s2c_opening_out_len)
{
    secp256k1_ecdsa_s2c_opening opening_secp;
    const secp256k1_context *ctx = secp_ctx();
    bool ok;

    if (!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN ||
        !bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !commitment || commitment_len != WALLY_HOST_COMMITMENT_LEN ||
        flags != EC_FLAG_ECDSA ||
        !s2c_opening_out || s2c_opening_out_len != WALLY_S2C_OPENING_LEN)
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    ok = secp256k1_ecdsa_anti_exfil_signer_commit(ctx, &opening_secp, bytes, priv_key, commitment) &&
         secp256k1_ecdsa_s2c_opening_serialize(ctx, s2c_opening_out, &opening_secp);

    wally_clear(&opening_secp, sizeof(opening_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}